

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcSim.c
# Opt level: O3

void Wlc_NtkSimulatePrint(Wlc_Ntk_t *p,Vec_Int_t *vNodes,Vec_Ptr_t *vRes,int nWords,int nFrames)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  uint local_60;
  
  if (0 < nFrames) {
    iVar5 = 0;
    local_60 = 0;
    do {
      if (0 < nWords) {
        iVar3 = 0;
        do {
          uVar2 = local_60 + 0x40;
          do {
            if (0 < vNodes->nSize) {
              lVar6 = 0;
              do {
                lVar4 = (long)vNodes->pArray[lVar6];
                if ((lVar4 < 1) || (p->nObjsAlloc <= vNodes->pArray[lVar6])) {
                  __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlc.h"
                                ,0x9d,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
                }
                iVar8 = p->pObjs[lVar4].End - p->pObjs[lVar4].Beg;
                uVar1 = iVar8 + 1;
                if (0 < (int)uVar1) {
                  uVar7 = (ulong)uVar1;
                  iVar8 = iVar8 + 2;
                  do {
                    uVar7 = uVar7 - 1;
                    if (vRes->nSize <= lVar6) {
                      __assert_fail("i >= 0 && i < p->nSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecVec.h"
                                    ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
                    }
                    iVar8 = iVar8 + -1;
                    if (*(int *)((long)vRes->pArray[lVar6] + 4) < iVar8) {
                      __assert_fail("i >= 0 && i < p->nSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                    }
                    printf("%d",(ulong)((*(uint *)(*(long *)(*(long *)((long)vRes->pArray[lVar6] + 8
                                                                      ) + (uVar7 & 0xffffffff) * 8)
                                                  + (long)((int)local_60 >> 5) * 4) >>
                                         (local_60 & 0x1f) & 1) != 0));
                  } while (1 < iVar8);
                }
                putchar(0x20);
                lVar6 = lVar6 + 1;
              } while (lVar6 < vNodes->nSize);
            }
            local_60 = local_60 + 1;
            putchar(10);
          } while (local_60 != uVar2);
          iVar3 = iVar3 + 1;
          local_60 = uVar2;
        } while (iVar3 != nWords);
      }
      iVar5 = iVar5 + 1;
      putchar(10);
    } while (iVar5 != nFrames);
  }
  return;
}

Assistant:

void Wlc_NtkSimulatePrint( Wlc_Ntk_t * p, Vec_Int_t * vNodes, Vec_Ptr_t * vRes, int nWords, int nFrames )
{
    Wlc_Obj_t * pWlcObj; 
    int f, w, b, i, k, iPat = 0;
    for ( f = 0; f < nFrames; f++, printf("\n") )
      for ( w = 0; w < nWords; w++ )
        for ( b = 0; b < 64; b++, iPat++, printf("\n") )
        {
            Wlc_NtkForEachObjVec( vNodes, p, pWlcObj, i )
            {
                int nBits = Wlc_ObjRange(pWlcObj);
                for ( k = nBits-1; k >= 0; k-- )
                {
                    word * pInfo = (word*)Vec_VecEntryEntry( (Vec_Vec_t *)vRes, i, k );
                    printf( "%d", Abc_InfoHasBit((unsigned *)pInfo, iPat) );
                }
                printf( " " );
            }
        }
}